

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O1

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysics
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  TPZBaseMatrix *pTVar1;
  long lVar2;
  
  pTVar1 = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(&MFMesh->fSolution);
  lVar2 = __dynamic_cast(pTVar1,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
  if (lVar2 != 0) {
    TransferFromMultiPhysicsT<double>(cmeshVec,MFMesh);
    return;
  }
  TransferFromMultiPhysicsT<std::complex<double>>(cmeshVec,MFMesh);
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysics(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    TPZBaseMatrix &solMF = MFMesh->Solution();
    
    auto *realSol = dynamic_cast<TPZFMatrix<STATE>*>(&solMF);
    auto *cplxSol = dynamic_cast<TPZFMatrix<CSTATE>*>(&solMF);
    if(realSol) TransferFromMultiPhysicsT<STATE>(cmeshVec,MFMesh);
    else TransferFromMultiPhysicsT<CSTATE>(cmeshVec,MFMesh);
}